

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

void setupMultiArrayFeature(FeatureDescription *feature,string *name)

{
  Arena *pAVar1;
  FeatureType *pFVar2;
  ArrayFeatureType *pAVar3;
  string *name_local;
  FeatureDescription *feature_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&feature->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,pAVar1);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(feature);
  pAVar3 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar3,ArrayFeatureType_ArrayDataType_FLOAT32);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(feature);
  pAVar3 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar3,1);
  return;
}

Assistant:

static void setupMultiArrayFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    feature->mutable_type()->mutable_multiarraytype()->add_shape(1);
}